

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7Dec.c
# Opt level: O1

int Ppmd7_DecodeSymbol(CPpmd7 *p,IPpmd7_RangeDec *rc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  Byte *pBVar6;
  CPpmd_State *pCVar7;
  bool bVar8;
  UInt16 UVar9;
  UInt32 UVar10;
  uint uVar11;
  int iVar12;
  CPpmd_See *pCVar13;
  long *plVar14;
  byte *pbVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  UInt16 *pUVar19;
  uint unaff_EBP;
  UInt32 UVar20;
  CPpmd7_Context *pCVar21;
  uint uVar22;
  byte *pbVar23;
  UInt32 freqSum;
  size_t charMask [32];
  CPpmd_State *ps [256];
  uint local_944;
  IPpmd7_RangeDec *local_940;
  char local_938 [256];
  long local_838 [257];
  
  pCVar21 = p->MinContext;
  local_940 = rc;
  if (pCVar21->NumStats == 1) {
    bVar1 = *(byte *)((long)&pCVar21->SummFreq + 1);
    bVar2 = p->NS2BSIndx[(ulong)*(ushort *)(p->Base + pCVar21->Suffix) - 1];
    bVar3 = p->HB2Flag[p->FoundState->Symbol];
    p->HiBitsFlag = (uint)bVar3;
    pUVar19 = p->BinSumm[(ulong)bVar1 - 1] +
              (((uint)p->RunLength >> 0x1a & 0xffffffe0) +
              (uint)bVar2 + p->PrevSuccess + (uint)bVar3 +
              (uint)p->HB2Flag[(byte)pCVar21->SummFreq] * 2);
    UVar10 = (*rc->DecodeBit)(rc,(uint)*pUVar19);
    uVar4 = *pUVar19;
    if (UVar10 == 0) {
      *pUVar19 = (uVar4 - (short)(uVar4 + 0x20 >> 7)) + 0x80;
      p->FoundState = (CPpmd_State *)&p->MinContext->SummFreq;
      UVar9 = p->MinContext->SummFreq;
      Ppmd7_UpdateBin(p);
      return (uint)(byte)UVar9;
    }
    uVar11 = (uint)uVar4 - (uVar4 + 0x20 >> 7);
    *pUVar19 = (ushort)uVar11;
    p->InitEsc = (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
                       [(uVar11 & 0xffff) >> 10];
    memset(local_938,0xff,0x100);
    local_938[(byte)p->MinContext->SummFreq] = '\0';
    p->PrevSuccess = 0;
  }
  else {
    pBVar6 = p->Base;
    uVar17 = (ulong)pCVar21->Stats;
    UVar10 = (*rc->GetThreshold)(rc,(uint)pCVar21->SummFreq);
    bVar1 = pBVar6[uVar17 + 1];
    if (UVar10 < bVar1) {
      bVar8 = false;
      (*rc->Decode)(rc,0,(uint)bVar1);
      p->FoundState = (CPpmd_State *)(pBVar6 + uVar17);
      unaff_EBP = (uint)((CPpmd_State *)(pBVar6 + uVar17))->Symbol;
      Ppmd7_Update1_0(p);
    }
    else {
      p->PrevSuccess = 0;
      iVar12 = p->MinContext->NumStats - 1;
      pbVar15 = pBVar6 + (uVar17 - 6);
      uVar11 = (uint)bVar1;
      do {
        pbVar23 = pbVar15;
        UVar20 = uVar11 + pbVar23[0xd];
        if (UVar10 < UVar20) {
          (*rc->Decode)(rc,uVar11,(uint)pbVar23[0xd]);
          p->FoundState = (CPpmd_State *)(pbVar23 + 0xc);
          unaff_EBP = (uint)pbVar23[0xc];
          Ppmd7_Update1(p);
          goto LAB_00711887;
        }
        pbVar15 = pbVar23 + 6;
        iVar12 = iVar12 + -1;
        uVar11 = UVar20;
      } while (iVar12 != 0);
      uVar11 = (uint)p->MinContext->SummFreq;
      if (UVar10 < uVar11) {
        p->HiBitsFlag = (uint)p->HB2Flag[p->FoundState->Symbol];
        (*rc->Decode)(rc,UVar20,uVar11 - UVar20);
        memset(local_938,0xff,0x100);
        local_938[pbVar23[0xc]] = '\0';
        iVar12 = p->MinContext->NumStats - 1;
        do {
          local_938[*pbVar15] = '\0';
          pbVar15 = pbVar15 + -6;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
        bVar8 = true;
      }
      else {
        unaff_EBP = 0xfffffffe;
LAB_00711887:
        bVar8 = false;
      }
    }
    if (!bVar8) {
      return unaff_EBP;
    }
  }
  do {
    pCVar21 = p->MinContext;
    uVar4 = pCVar21->NumStats;
    uVar11 = p->OrderFall;
    do {
      uVar17 = (ulong)pCVar21->Suffix;
      if (uVar17 == 0) {
        p->OrderFall = uVar11 + 1;
        unaff_EBP = 0xffffffff;
        goto LAB_007119eb;
      }
      pBVar6 = p->Base;
      pCVar21 = (CPpmd7_Context *)(pBVar6 + uVar17);
      p->MinContext = pCVar21;
      uVar5 = *(ushort *)(pBVar6 + uVar17);
      uVar11 = uVar11 + 1;
    } while (uVar5 == uVar4);
    p->OrderFall = uVar11;
    pbVar15 = pBVar6 + *(uint *)(pBVar6 + uVar17 + 4);
    uVar22 = 0;
    uVar11 = 0;
    do {
      uVar16 = uVar11;
      uVar18 = (uint)local_938[*pbVar15];
      uVar22 = uVar22 + (pbVar15[1] & uVar18);
      local_838[uVar16] = (long)pbVar15;
      pbVar15 = pbVar15 + 6;
      uVar11 = uVar16 - uVar18;
    } while (uVar16 - uVar18 != (uint)uVar5 - (uint)uVar4);
    pCVar13 = Ppmd7_MakeEscFreq(p,(uint)uVar4,&local_944);
    local_944 = local_944 + uVar22;
    UVar10 = (*local_940->GetThreshold)(local_940,local_944);
    if (UVar10 < uVar22) {
      plVar14 = local_838;
      uVar11 = 0;
      do {
        UVar20 = uVar11;
        pCVar7 = (CPpmd_State *)*plVar14;
        uVar11 = UVar20 + pCVar7->Freq;
        plVar14 = plVar14 + 1;
      } while (uVar11 <= UVar10);
      (*local_940->Decode)(local_940,UVar20,(uint)pCVar7->Freq);
      bVar1 = pCVar13->Shift;
      if (bVar1 < 7) {
        pBVar6 = &pCVar13->Count;
        *pBVar6 = *pBVar6 + 0xff;
        if (*pBVar6 == '\0') {
          pCVar13->Summ = pCVar13->Summ << 1;
          pCVar13->Shift = bVar1 + 1;
          pCVar13->Count = (Byte)(3 << (bVar1 & 0x1f));
        }
      }
      p->FoundState = pCVar7;
      unaff_EBP = (uint)pCVar7->Symbol;
      Ppmd7_Update2(p);
LAB_007119eb:
      bVar8 = false;
    }
    else {
      if (local_944 <= UVar10) {
        unaff_EBP = 0xfffffffe;
        goto LAB_007119eb;
      }
      (*local_940->Decode)(local_940,uVar22,local_944 - uVar22);
      pCVar13->Summ = pCVar13->Summ + (short)local_944;
      iVar12 = uVar18 - uVar16;
      plVar14 = local_838 + (~uVar18 + uVar16);
      do {
        local_938[*(byte *)*plVar14] = '\0';
        plVar14 = plVar14 + -1;
        iVar12 = iVar12 + 1;
      } while (iVar12 != 0);
      bVar8 = true;
    }
    if (!bVar8) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

int Ppmd7_DecodeSymbol(CPpmd7 *p, IPpmd7_RangeDec *rc)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 1)
  {
    CPpmd_State *s = Ppmd7_GetStats(p, p->MinContext);
    unsigned i;
    UInt32 count, hiCnt;
    if ((count = rc->GetThreshold(rc, p->MinContext->SummFreq)) < (hiCnt = s->Freq))
    {
      Byte symbol;
      rc->Decode(rc, 0, s->Freq);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update1_0(p);
      return symbol;
    }
    p->PrevSuccess = 0;
    i = p->MinContext->NumStats - 1;
    do
    {
      if ((hiCnt += (++s)->Freq) > count)
      {
        Byte symbol;
        rc->Decode(rc, hiCnt - s->Freq, s->Freq);
        p->FoundState = s;
        symbol = s->Symbol;
        Ppmd7_Update1(p);
        return symbol;
      }
    }
    while (--i);
    if (count >= p->MinContext->SummFreq)
      return -2;
    p->HiBitsFlag = p->HB2Flag[p->FoundState->Symbol];
    rc->Decode(rc, hiCnt, p->MinContext->SummFreq - hiCnt);
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats - 1;
    do { MASK((--s)->Symbol) = 0; } while (--i);
  }
  else
  {
    UInt16 *prob = Ppmd7_GetBinSumm(p);
    if (rc->DecodeBit(rc, *prob) == 0)
    {
      Byte symbol;
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      symbol = (p->FoundState = Ppmd7Context_OneState(p->MinContext))->Symbol;
      Ppmd7_UpdateBin(p);
      return symbol;
    }
    *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
    p->InitEsc = PPMD7_kExpEscape[*prob >> 10];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(Ppmd7Context_OneState(p->MinContext)->Symbol) = 0;
    p->PrevSuccess = 0;
  }
  for (;;)
  {
    CPpmd_State *ps[256], *s;
    UInt32 freqSum, count, hiCnt;
    CPpmd_See *see;
    unsigned i, num, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return -1;
      p->MinContext = Ppmd7_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    hiCnt = 0;
    s = Ppmd7_GetStats(p, p->MinContext);
    i = 0;
    num = p->MinContext->NumStats - numMasked;
    do
    {
      int k = (int)(MASK(s->Symbol));
      hiCnt += (s->Freq & k);
      ps[i] = s++;
      i -= k;
    }
    while (i != num);
    
    see = Ppmd7_MakeEscFreq(p, numMasked, &freqSum);
    freqSum += hiCnt;
    count = rc->GetThreshold(rc, freqSum);
    
    if (count < hiCnt)
    {
      Byte symbol;
      CPpmd_State **pps = ps;
      for (hiCnt = 0; (hiCnt += (*pps)->Freq) <= count; pps++);
      s = *pps;
      rc->Decode(rc, hiCnt - s->Freq, s->Freq);
      Ppmd_See_Update(see);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update2(p);
      return symbol;
    }
    if (count >= freqSum)
      return -2;
    rc->Decode(rc, hiCnt, freqSum - hiCnt);
    see->Summ = (UInt16)(see->Summ + freqSum);
    do { MASK(ps[--i]->Symbol) = 0; } while (i != 0);
  }
}